

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ScopeRandomizeFunction::checkArguments
          (ScopeRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Symbol *this_01;
  DeclaredType *this_02;
  Type *pTVar7;
  Diagnostic *pDVar8;
  long lVar9;
  Args *__range3;
  string_view arg;
  Type *local_40;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar5 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,0,0x7fffffff);
  lVar9 = 400;
  if (bVar5) {
    sVar2 = (args->_M_extent)._M_extent_value;
    bVar5 = sVar2 == 0;
    if (!bVar5) {
      ppEVar3 = args->_M_ptr;
      lVar9 = 0;
      do {
        this_00 = *(Expression **)((long)ppEVar3 + lVar9);
        this_01 = Expression::getSymbolReference(this_00,true);
        if ((this_01 == (Symbol *)0x0) || (this_00->kind != NamedValue)) {
          ASTContext::addDiag(context,(DiagCode)0xf000b,this_00->sourceRange);
          local_40 = pCVar1->errorType;
          bVar4 = false;
        }
        else {
          this_02 = Symbol::getDeclaredType(this_01);
          pTVar7 = DeclaredType::getType(this_02);
          bVar6 = Type::isValidForRand(pTVar7,Rand,(pCVar1->options).languageVersion);
          bVar4 = true;
          if (!bVar6) {
            pDVar8 = ASTContext::addDiag(context,(DiagCode)0x610006,this_00->sourceRange);
            pTVar7 = DeclaredType::getType(this_02);
            pDVar8 = ast::operator<<(pDVar8,pTVar7);
            arg._M_str = "rand";
            arg._M_len = 4;
            Diagnostic::operator<<(pDVar8,arg);
          }
        }
        if (!bVar4) break;
        lVar9 = lVar9 + 8;
        bVar5 = sVar2 << 3 == lVar9;
      } while (!bVar5);
    }
    lVar9 = 0x158;
    if (!bVar5) {
      return local_40;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar9);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        for (auto arg : args) {
            auto sym = arg->getSymbolReference();
            if (!sym || arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedVariableName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto dt = sym->getDeclaredType();
            SLANG_ASSERT(dt);
            if (!dt->getType().isValidForRand(RandMode::Rand, comp.languageVersion())) {
                context.addDiag(diag::InvalidRandType, arg->sourceRange)
                    << dt->getType() << "rand"sv;
            }
        }

        return comp.getIntType();
    }